

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjFileImporter.cpp
# Opt level: O2

aiMesh * __thiscall
Assimp::ObjFileImporter::createTopology
          (ObjFileImporter *this,Model *pModel,Object *pData,uint meshIndex)

{
  Mesh *pMVar1;
  size_t __n;
  long lVar2;
  int *piVar3;
  unique_ptr<aiMesh,_std::default_delete<aiMesh>_> uVar4;
  int iVar5;
  tuple<aiMesh_*,_std::default_delete<aiMesh>_> this_00;
  ulong uVar6;
  ulong *puVar7;
  void *pvVar8;
  uint uVar9;
  uint uVar10;
  ulong *puVar11;
  long lVar12;
  _Head_base<0UL,_aiMesh_*,_false> _Var13;
  ulong uVar14;
  size_t i;
  ulong uVar15;
  unique_ptr<aiMesh,_std::default_delete<aiMesh>_> pMesh;
  
  if (pModel == (Model *)0x0) {
    __assert_fail("__null != pModel",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/Obj/ObjFileImporter.cpp"
                  ,0x13c,
                  "aiMesh *Assimp::ObjFileImporter::createTopology(const ObjFile::Model *, const ObjFile::Object *, unsigned int)"
                 );
  }
  if (((pData == (Object *)0x0) ||
      (pMVar1 = (pModel->m_Meshes).
                super__Vector_base<Assimp::ObjFile::Mesh_*,_std::allocator<Assimp::ObjFile::Mesh_*>_>
                ._M_impl.super__Vector_impl_data._M_start[meshIndex], pMVar1 == (Mesh *)0x0)) ||
     ((pMVar1->m_Faces).
      super__Vector_base<Assimp::ObjFile::Face_*,_std::allocator<Assimp::ObjFile::Face_*>_>._M_impl.
      super__Vector_impl_data._M_start ==
      *(pointer *)
       ((long)&(pMVar1->m_Faces).
               super__Vector_base<Assimp::ObjFile::Face_*,_std::allocator<Assimp::ObjFile::Face_*>_>
               ._M_impl + 8))) {
    _Var13._M_head_impl = (aiMesh *)0x0;
  }
  else {
    this_00.super__Tuple_impl<0UL,_aiMesh_*,_std::default_delete<aiMesh>_>.
    super__Head_base<0UL,_aiMesh_*,_false>._M_head_impl =
         (_Tuple_impl<0UL,_aiMesh_*,_std::default_delete<aiMesh>_>)operator_new(0x520);
    _Var13._M_head_impl =
         (aiMesh *)
         this_00.super__Tuple_impl<0UL,_aiMesh_*,_std::default_delete<aiMesh>_>.
         super__Head_base<0UL,_aiMesh_*,_false>._M_head_impl;
    aiMesh::aiMesh((aiMesh *)
                   this_00.super__Tuple_impl<0UL,_aiMesh_*,_std::default_delete<aiMesh>_>.
                   super__Head_base<0UL,_aiMesh_*,_false>._M_head_impl);
    __n = (pMVar1->m_name)._M_string_length;
    pMesh._M_t.super___uniq_ptr_impl<aiMesh,_std::default_delete<aiMesh>_>._M_t.
    super__Tuple_impl<0UL,_aiMesh_*,_std::default_delete<aiMesh>_>.
    super__Head_base<0UL,_aiMesh_*,_false>._M_head_impl =
         (__uniq_ptr_data<aiMesh,_std::default_delete<aiMesh>,_true,_true>)
         (__uniq_ptr_data<aiMesh,_std::default_delete<aiMesh>,_true,_true>)
         this_00.super__Tuple_impl<0UL,_aiMesh_*,_std::default_delete<aiMesh>_>.
         super__Head_base<0UL,_aiMesh_*,_false>._M_head_impl;
    if (0xfffffffffffffc00 < __n - 0x400) {
      ((aiString *)
      ((long)this_00.super__Tuple_impl<0UL,_aiMesh_*,_std::default_delete<aiMesh>_>.
             super__Head_base<0UL,_aiMesh_*,_false>._M_head_impl + 0xec))->length = (ai_uint32)__n;
      _Var13._M_head_impl =
           (aiMesh *)
           ((long)this_00.super__Tuple_impl<0UL,_aiMesh_*,_std::default_delete<aiMesh>_>.
                  super__Head_base<0UL,_aiMesh_*,_false>._M_head_impl + 0xf0);
      memcpy(_Var13._M_head_impl,(pMVar1->m_name)._M_dataplus._M_p,__n);
      ((char *)((long)this_00.super__Tuple_impl<0UL,_aiMesh_*,_std::default_delete<aiMesh>_>.
                      super__Head_base<0UL,_aiMesh_*,_false>._M_head_impl + 0xf0))[__n] = '\0';
    }
    uVar4._M_t.super___uniq_ptr_impl<aiMesh,_std::default_delete<aiMesh>_>._M_t.
    super__Tuple_impl<0UL,_aiMesh_*,_std::default_delete<aiMesh>_>.
    super__Head_base<0UL,_aiMesh_*,_false>._M_head_impl =
         pMesh._M_t.super___uniq_ptr_impl<aiMesh,_std::default_delete<aiMesh>_>._M_t.
         super__Tuple_impl<0UL,_aiMesh_*,_std::default_delete<aiMesh>_>.
         super__Head_base<0UL,_aiMesh_*,_false>._M_head_impl;
    for (uVar6 = 0;
        lVar2 = *(long *)&(pMVar1->m_Faces).
                          super__Vector_base<Assimp::ObjFile::Face_*,_std::allocator<Assimp::ObjFile::Face_*>_>
                          ._M_impl.super__Vector_impl_data,
        uVar6 < (ulong)((long)*(pointer *)
                               ((long)&(pMVar1->m_Faces).
                                       super__Vector_base<Assimp::ObjFile::Face_*,_std::allocator<Assimp::ObjFile::Face_*>_>
                                       ._M_impl + 8) - lVar2 >> 3); uVar6 = uVar6 + 1) {
      piVar3 = *(int **)(lVar2 + uVar6 * 8);
      if (piVar3 == (int *)0x0) {
        __assert_fail("__null != inp",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/Obj/ObjFileImporter.cpp"
                      ,0x154,
                      "aiMesh *Assimp::ObjFileImporter::createTopology(const ObjFile::Model *, const ObjFile::Object *, unsigned int)"
                     );
      }
      if (*piVar3 == 1) {
        *(int *)((long)pMesh._M_t.super___uniq_ptr_impl<aiMesh,_std::default_delete<aiMesh>_>._M_t.
                       super__Tuple_impl<0UL,_aiMesh_*,_std::default_delete<aiMesh>_>.
                       super__Head_base<0UL,_aiMesh_*,_false>._M_head_impl + 8) =
             *(int *)((long)pMesh._M_t.super___uniq_ptr_impl<aiMesh,_std::default_delete<aiMesh>_>.
                            _M_t.super__Tuple_impl<0UL,_aiMesh_*,_std::default_delete<aiMesh>_>.
                            super__Head_base<0UL,_aiMesh_*,_false>._M_head_impl + 8) +
             (int)((ulong)(*(long *)(piVar3 + 4) - *(long *)(piVar3 + 2)) >> 2);
        *(byte *)pMesh._M_t.super___uniq_ptr_impl<aiMesh,_std::default_delete<aiMesh>_>._M_t.
                 super__Tuple_impl<0UL,_aiMesh_*,_std::default_delete<aiMesh>_>.
                 super__Head_base<0UL,_aiMesh_*,_false>._M_head_impl =
             *(byte *)pMesh._M_t.super___uniq_ptr_impl<aiMesh,_std::default_delete<aiMesh>_>._M_t.
                      super__Tuple_impl<0UL,_aiMesh_*,_std::default_delete<aiMesh>_>.
                      super__Head_base<0UL,_aiMesh_*,_false>._M_head_impl | 1;
      }
      else if (*piVar3 == 2) {
        *(int *)((long)pMesh._M_t.super___uniq_ptr_impl<aiMesh,_std::default_delete<aiMesh>_>._M_t.
                       super__Tuple_impl<0UL,_aiMesh_*,_std::default_delete<aiMesh>_>.
                       super__Head_base<0UL,_aiMesh_*,_false>._M_head_impl + 8) =
             (int)((ulong)(*(long *)(piVar3 + 4) - *(long *)(piVar3 + 2)) >> 2) +
             *(int *)((long)pMesh._M_t.super___uniq_ptr_impl<aiMesh,_std::default_delete<aiMesh>_>.
                            _M_t.super__Tuple_impl<0UL,_aiMesh_*,_std::default_delete<aiMesh>_>.
                            super__Head_base<0UL,_aiMesh_*,_false>._M_head_impl + 8) + -1;
        *(byte *)pMesh._M_t.super___uniq_ptr_impl<aiMesh,_std::default_delete<aiMesh>_>._M_t.
                 super__Tuple_impl<0UL,_aiMesh_*,_std::default_delete<aiMesh>_>.
                 super__Head_base<0UL,_aiMesh_*,_false>._M_head_impl =
             *(byte *)pMesh._M_t.super___uniq_ptr_impl<aiMesh,_std::default_delete<aiMesh>_>._M_t.
                      super__Tuple_impl<0UL,_aiMesh_*,_std::default_delete<aiMesh>_>.
                      super__Head_base<0UL,_aiMesh_*,_false>._M_head_impl | 2;
      }
      else {
        *(int *)((long)pMesh._M_t.super___uniq_ptr_impl<aiMesh,_std::default_delete<aiMesh>_>._M_t.
                       super__Tuple_impl<0UL,_aiMesh_*,_std::default_delete<aiMesh>_>.
                       super__Head_base<0UL,_aiMesh_*,_false>._M_head_impl + 8) =
             *(int *)((long)pMesh._M_t.super___uniq_ptr_impl<aiMesh,_std::default_delete<aiMesh>_>.
                            _M_t.super__Tuple_impl<0UL,_aiMesh_*,_std::default_delete<aiMesh>_>.
                            super__Head_base<0UL,_aiMesh_*,_false>._M_head_impl + 8) + 1;
        if ((ulong)(*(long *)(piVar3 + 4) - *(long *)(piVar3 + 2)) < 0xd) {
          uVar9 = *(uint *)pMesh._M_t.super___uniq_ptr_impl<aiMesh,_std::default_delete<aiMesh>_>.
                           _M_t.super__Tuple_impl<0UL,_aiMesh_*,_std::default_delete<aiMesh>_>.
                           super__Head_base<0UL,_aiMesh_*,_false>._M_head_impl | 4;
        }
        else {
          uVar9 = *(uint *)pMesh._M_t.super___uniq_ptr_impl<aiMesh,_std::default_delete<aiMesh>_>.
                           _M_t.super__Tuple_impl<0UL,_aiMesh_*,_std::default_delete<aiMesh>_>.
                           super__Head_base<0UL,_aiMesh_*,_false>._M_head_impl | 8;
        }
        *(uint *)pMesh._M_t.super___uniq_ptr_impl<aiMesh,_std::default_delete<aiMesh>_>._M_t.
                 super__Tuple_impl<0UL,_aiMesh_*,_std::default_delete<aiMesh>_>.
                 super__Head_base<0UL,_aiMesh_*,_false>._M_head_impl = uVar9;
      }
    }
    uVar6 = (ulong)*(uint *)((long)pMesh._M_t.
                                   super___uniq_ptr_impl<aiMesh,_std::default_delete<aiMesh>_>._M_t.
                                   super__Tuple_impl<0UL,_aiMesh_*,_std::default_delete<aiMesh>_>.
                                   super__Head_base<0UL,_aiMesh_*,_false>._M_head_impl + 8);
    if (uVar6 == 0) {
      uVar9 = 0;
    }
    else {
      _Var13._M_head_impl = (aiMesh *)(uVar6 * 0x10 + 8);
      puVar7 = (ulong *)operator_new__((ulong)_Var13._M_head_impl);
      *puVar7 = uVar6;
      puVar11 = puVar7 + 1;
      do {
        *(undefined4 *)puVar11 = 0;
        puVar11[1] = 0;
        puVar11 = puVar11 + 2;
      } while (puVar11 != puVar7 + uVar6 * 2 + 1);
      *(ulong **)
       ((long)uVar4._M_t.super___uniq_ptr_impl<aiMesh,_std::default_delete<aiMesh>_>._M_t.
              super__Tuple_impl<0UL,_aiMesh_*,_std::default_delete<aiMesh>_>.
              super__Head_base<0UL,_aiMesh_*,_false>._M_head_impl + 0xd0) = puVar7 + 1;
      if (pMVar1->m_uiMaterialIndex != 0xffffffff) {
        *(uint *)((long)uVar4._M_t.super___uniq_ptr_impl<aiMesh,_std::default_delete<aiMesh>_>._M_t.
                        super__Tuple_impl<0UL,_aiMesh_*,_std::default_delete<aiMesh>_>.
                        super__Head_base<0UL,_aiMesh_*,_false>._M_head_impl + 0xe8) =
             pMVar1->m_uiMaterialIndex;
      }
      uVar9 = 0;
      uVar10 = 0;
      for (uVar6 = 0;
          lVar2 = *(long *)&(pMVar1->m_Faces).
                            super__Vector_base<Assimp::ObjFile::Face_*,_std::allocator<Assimp::ObjFile::Face_*>_>
                            ._M_impl.super__Vector_impl_data,
          uVar6 < (ulong)((long)*(pointer *)
                                 ((long)&(pMVar1->m_Faces).
                                         super__Vector_base<Assimp::ObjFile::Face_*,_std::allocator<Assimp::ObjFile::Face_*>_>
                                         ._M_impl + 8) - lVar2 >> 3); uVar6 = uVar6 + 1) {
        piVar3 = *(int **)(lVar2 + uVar6 * 8);
        uVar14 = (ulong)uVar10;
        if (*piVar3 == 2) {
          for (uVar15 = 0; uVar15 < (*(long *)(piVar3 + 4) - *(long *)(piVar3 + 2) >> 2) - 1U;
              uVar15 = uVar15 + 1) {
            lVar2 = *(long *)((long)pMesh._M_t.
                                    super___uniq_ptr_impl<aiMesh,_std::default_delete<aiMesh>_>._M_t
                                    .super__Tuple_impl<0UL,_aiMesh_*,_std::default_delete<aiMesh>_>.
                                    super__Head_base<0UL,_aiMesh_*,_false>._M_head_impl + 0xd0);
            lVar12 = (uVar14 + uVar15 & 0xffffffff) * 0x10;
            *(undefined4 *)(lVar2 + lVar12) = 2;
            _Var13._M_head_impl = (aiMesh *)0x8;
            pvVar8 = operator_new__(8);
            uVar9 = uVar9 + 2;
            *(void **)(lVar2 + lVar12 + 8) = pvVar8;
          }
LAB_003da18d:
          uVar10 = uVar10 + (int)uVar15;
        }
        else {
          if (*piVar3 == 1) {
            for (uVar15 = 0; uVar15 < (ulong)(*(long *)(piVar3 + 4) - *(long *)(piVar3 + 2) >> 2);
                uVar15 = uVar15 + 1) {
              lVar2 = *(long *)((long)pMesh._M_t.
                                      super___uniq_ptr_impl<aiMesh,_std::default_delete<aiMesh>_>.
                                      _M_t.
                                      super__Tuple_impl<0UL,_aiMesh_*,_std::default_delete<aiMesh>_>
                                      .super__Head_base<0UL,_aiMesh_*,_false>._M_head_impl + 0xd0);
              lVar12 = (uVar14 + uVar15 & 0xffffffff) * 0x10;
              *(undefined4 *)(lVar2 + lVar12) = 1;
              _Var13._M_head_impl = (aiMesh *)0x4;
              pvVar8 = operator_new__(4);
              *(void **)(lVar2 + lVar12 + 8) = pvVar8;
            }
            uVar9 = uVar9 + (int)uVar15;
            goto LAB_003da18d;
          }
          lVar2 = *(long *)((long)pMesh._M_t.
                                  super___uniq_ptr_impl<aiMesh,_std::default_delete<aiMesh>_>._M_t.
                                  super__Tuple_impl<0UL,_aiMesh_*,_std::default_delete<aiMesh>_>.
                                  super__Head_base<0UL,_aiMesh_*,_false>._M_head_impl + 0xd0);
          uVar10 = uVar10 + 1;
          _Var13._M_head_impl = (aiMesh *)(*(long *)(piVar3 + 4) - *(long *)(piVar3 + 2));
          iVar5 = (int)((ulong)_Var13._M_head_impl >> 2);
          *(int *)(lVar2 + uVar14 * 0x10) = iVar5;
          uVar9 = uVar9 + iVar5;
          if (iVar5 != 0) {
            _Var13._M_head_impl = (aiMesh *)((ulong)_Var13._M_head_impl & 0x3fffffffc);
            pvVar8 = operator_new__((ulong)_Var13._M_head_impl);
            *(void **)(lVar2 + uVar14 * 0x10 + 8) = pvVar8;
          }
        }
      }
    }
    createVertexArray((ObjFileImporter *)_Var13._M_head_impl,pModel,pData,meshIndex,
                      (aiMesh *)
                      pMesh._M_t.super___uniq_ptr_impl<aiMesh,_std::default_delete<aiMesh>_>._M_t.
                      super__Tuple_impl<0UL,_aiMesh_*,_std::default_delete<aiMesh>_>.
                      super__Head_base<0UL,_aiMesh_*,_false>._M_head_impl,uVar9);
    _Var13._M_head_impl = (aiMesh *)pMesh;
    pMesh._M_t.super___uniq_ptr_impl<aiMesh,_std::default_delete<aiMesh>_>._M_t.
    super__Tuple_impl<0UL,_aiMesh_*,_std::default_delete<aiMesh>_>.
    super__Head_base<0UL,_aiMesh_*,_false>._M_head_impl =
         (__uniq_ptr_data<aiMesh,_std::default_delete<aiMesh>,_true,_true>)
         (__uniq_ptr_impl<aiMesh,_std::default_delete<aiMesh>_>)0x0;
    std::unique_ptr<aiMesh,_std::default_delete<aiMesh>_>::~unique_ptr(&pMesh);
  }
  return (aiMesh *)(tuple<aiMesh_*,_std::default_delete<aiMesh>_>)_Var13._M_head_impl;
}

Assistant:

aiMesh *ObjFileImporter::createTopology( const ObjFile::Model* pModel, const ObjFile::Object* pData, unsigned int meshIndex ) {
    // Checking preconditions
    ai_assert( NULL != pModel );

    if( NULL == pData ) {
        return NULL;
    }

    // Create faces
    ObjFile::Mesh *pObjMesh = pModel->m_Meshes[ meshIndex ];
    if( !pObjMesh ) {
        return NULL;
    }

    if( pObjMesh->m_Faces.empty() ) {
        return NULL;
    }

    std::unique_ptr<aiMesh> pMesh(new aiMesh);
    if( !pObjMesh->m_name.empty() ) {
        pMesh->mName.Set( pObjMesh->m_name );
    }

    for (size_t index = 0; index < pObjMesh->m_Faces.size(); index++)
    {
        ObjFile::Face *const inp = pObjMesh->m_Faces[ index ];
        ai_assert( NULL != inp  );

        if (inp->m_PrimitiveType == aiPrimitiveType_LINE) {
            pMesh->mNumFaces += static_cast<unsigned int>(inp->m_vertices.size() - 1);
            pMesh->mPrimitiveTypes |= aiPrimitiveType_LINE;
        } else if (inp->m_PrimitiveType == aiPrimitiveType_POINT) {
            pMesh->mNumFaces += static_cast<unsigned int>(inp->m_vertices.size());
            pMesh->mPrimitiveTypes |= aiPrimitiveType_POINT;
        } else {
            ++pMesh->mNumFaces;
            if (inp->m_vertices.size() > 3) {
                pMesh->mPrimitiveTypes |= aiPrimitiveType_POLYGON;
            } else {
                pMesh->mPrimitiveTypes |= aiPrimitiveType_TRIANGLE;
            }
        }
    }

    unsigned int uiIdxCount( 0u );
    if ( pMesh->mNumFaces > 0 ) {
        pMesh->mFaces = new aiFace[ pMesh->mNumFaces ];
        if ( pObjMesh->m_uiMaterialIndex != ObjFile::Mesh::NoMaterial ) {
            pMesh->mMaterialIndex = pObjMesh->m_uiMaterialIndex;
        }

        unsigned int outIndex( 0 );

        // Copy all data from all stored meshes
        for (size_t index = 0; index < pObjMesh->m_Faces.size(); index++) {
            ObjFile::Face* const inp = pObjMesh->m_Faces[ index ];
            if (inp->m_PrimitiveType == aiPrimitiveType_LINE) {
                for(size_t i = 0; i < inp->m_vertices.size() - 1; ++i) {
                    aiFace& f = pMesh->mFaces[ outIndex++ ];
                    uiIdxCount += f.mNumIndices = 2;
                    f.mIndices = new unsigned int[2];
                }
                continue;
            }
            else if (inp->m_PrimitiveType == aiPrimitiveType_POINT) {
                for(size_t i = 0; i < inp->m_vertices.size(); ++i) {
                    aiFace& f = pMesh->mFaces[ outIndex++ ];
                    uiIdxCount += f.mNumIndices = 1;
                    f.mIndices = new unsigned int[1];
                }
                continue;
            }

            aiFace *pFace = &pMesh->mFaces[ outIndex++ ];
            const unsigned int uiNumIndices = (unsigned int) pObjMesh->m_Faces[ index ]->m_vertices.size();
            uiIdxCount += pFace->mNumIndices = (unsigned int) uiNumIndices;
            if (pFace->mNumIndices > 0) {
                pFace->mIndices = new unsigned int[ uiNumIndices ];
            }
        }
    }

    // Create mesh vertices
    createVertexArray(pModel, pData, meshIndex, pMesh.get(), uiIdxCount);

    return pMesh.release();
}